

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_block(Parser *psr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  _Bool have_statement;
  int next_slot;
  int locals_count;
  Parser *psr_local;
  
  iVar1 = psr->locals_count;
  iVar2 = psr->scope->next_slot;
  bVar4 = true;
  while (bVar4) {
    iVar3 = (psr->lxr).tk.type;
    if (iVar3 == 0x28) {
      parse_expr(psr);
    }
    else if (iVar3 == 0x10c) {
      parse_let(psr);
    }
    else if (iVar3 == 0x10d) {
      parse_if(psr);
    }
    else if (iVar3 == 0x110) {
      parse_loop(psr);
    }
    else if (iVar3 == 0x111) {
      parse_while(psr);
    }
    else if (iVar3 == 0x113) {
      parse_fn(psr);
    }
    else if (iVar3 == 0x114) {
      parse_assign_or_expr(psr);
    }
    else {
      bVar4 = false;
    }
  }
  psr->locals_count = iVar1;
  psr->scope->next_slot = iVar2;
  return;
}

Assistant:

static void parse_block(Parser *psr) {
	// Save the initial number of locals and the next slot, so we can discard
	// the locals created in this block once we reach the end of it
	int locals_count = psr->locals_count;
	int next_slot = psr->scope->next_slot;

	// Continually parse statements
	bool have_statement = true;
	while (have_statement) {
		switch (psr->lxr.tk.type) {
			case TK_LET:   parse_let(psr); break;
			case TK_IDENT: parse_assign_or_expr(psr); break;
			case '(':      parse_expr(psr); break;
			case TK_IF:    parse_if(psr); break;
			case TK_LOOP:  parse_loop(psr); break;
			case TK_WHILE: parse_while(psr); break;
			case TK_FN:    parse_fn(psr); break;

			// Couldn't find a statement to parse
		default:
			have_statement = false;
			break;
		}
	}

	// Discard all locals created in this block
	psr->locals_count = locals_count;
	psr->scope->next_slot = next_slot;
}